

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::console::console_func>::clear(vector<crnlib::console::console_func> *this)

{
  if (this->m_p != (console_func *)0x0) {
    crnlib_free(this->m_p);
    this->m_p = (console_func *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  return;
}

Assistant:

inline void clear() {
    if (m_p) {
      scalar_type<T>::destruct_array(m_p, m_size);
      crnlib_free(m_p);
      m_p = NULL;
      m_size = 0;
      m_capacity = 0;
    }
  }